

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uspoof_impl.cpp
# Opt level: O0

void icu_63::uspoof_loadDefaultData(UErrorCode *status)

{
  UBool UVar1;
  UDataMemory *udm_00;
  SpoofData *pSVar2;
  char *p;
  SpoofData *local_40;
  UDataMemory *udm;
  UErrorCode *status_local;
  
  p = "cfu";
  udm_00 = udata_openChoice_63((char *)0x0,"cfu","confusables",spoofDataIsAcceptable,(void *)0x0,
                               status);
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    pSVar2 = (SpoofData *)UMemory::operator_new((UMemory *)0x38,(size_t)p);
    local_40 = (SpoofData *)0x0;
    if (pSVar2 != (SpoofData *)0x0) {
      SpoofData::SpoofData(pSVar2,udm_00,status);
      p = (char *)udm_00;
      local_40 = pSVar2;
    }
    gDefaultSpoofData = local_40;
    UVar1 = ::U_FAILURE(*status);
    pSVar2 = gDefaultSpoofData;
    if (UVar1 == '\0') {
      if (gDefaultSpoofData == (SpoofData *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
      }
      else {
        ucln_i18n_registerCleanup_63(UCLN_I18N_SPOOFDATA,uspoof_cleanupDefaultData);
      }
    }
    else {
      if (gDefaultSpoofData != (SpoofData *)0x0) {
        SpoofData::~SpoofData(gDefaultSpoofData);
        UMemory::operator_delete((UMemory *)pSVar2,p);
      }
      gDefaultSpoofData = (SpoofData *)0x0;
    }
  }
  return;
}

Assistant:

static void U_CALLCONV uspoof_loadDefaultData(UErrorCode& status) {
    UDataMemory *udm = udata_openChoice(nullptr, "cfu", "confusables",
                                        spoofDataIsAcceptable, 
                                        nullptr,       // context, would receive dataVersion if supplied.
                                        &status);
    if (U_FAILURE(status)) { return; }
    gDefaultSpoofData = new SpoofData(udm, status);
    if (U_FAILURE(status)) {
        delete gDefaultSpoofData;
        gDefaultSpoofData = nullptr;
        return;
    }
    if (gDefaultSpoofData == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    ucln_i18n_registerCleanup(UCLN_I18N_SPOOFDATA, uspoof_cleanupDefaultData);
}